

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.cc
# Opt level: O2

void __thiscall
fasttext::Dictionary::addNgrams(Dictionary *this,vector<int,_std::allocator<int>_> *line,int32_t n)

{
  undefined4 in_register_00000014;
  int iVar1;
  long lVar2;
  ulong uVar3;
  int local_5c;
  ulong local_58;
  undefined8 local_50;
  ulong local_48;
  ulong local_40;
  long local_38;
  
  local_50 = CONCAT44(in_register_00000014,n);
  local_58 = (ulong)((long)(line->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                           super__Vector_impl_data._M_finish -
                    (long)(line->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                          super__Vector_impl_data._M_start) >> 2;
  local_48 = (ulong)(~((int)(uint)local_58 >> 0x1f) & (uint)local_58);
  lVar2 = 1;
  for (local_40 = 0; local_40 != local_48; local_40 = local_40 + 1) {
    uVar3 = (ulong)(line->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start[local_40];
    iVar1 = (int)local_40 + (int)local_50;
    local_38 = lVar2;
    if ((int)local_58 < iVar1) {
      iVar1 = (int)local_58;
    }
    for (; (int)lVar2 < iVar1; lVar2 = lVar2 + 1) {
      uVar3 = (long)(line->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_start[lVar2] + uVar3 * 0x6eac5db;
      local_5c = (int)(uVar3 % (ulong)(long)((this->args_).
                                             super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>
                                            ._M_ptr)->bucket) + this->nwords_;
      std::vector<int,_std::allocator<int>_>::emplace_back<int>(line,&local_5c);
    }
    lVar2 = local_38 + 1;
  }
  return;
}

Assistant:

void Dictionary::addNgrams(std::vector<int32_t>& line, int32_t n) const {
  int32_t line_size = line.size();
  for (int32_t i = 0; i < line_size; i++) {
    uint64_t h = line[i];
    for (int32_t j = i + 1; j < line_size && j < i + n; j++) {
      h = h * 116049371 + line[j];
      line.push_back(nwords_ + (h % args_->bucket));
    }
  }
}